

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O3

void Lpk_NodeCutSignature(Lpk_Cut_t *pCut)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  pCut->uSign[0] = 0;
  pCut->uSign[1] = 0;
  uVar3 = *(uint *)pCut & 0x3f;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      uVar2 = pCut->pLeaves[uVar4];
      puVar1 = (uint *)((long)pCut->uSign + (ulong)(uVar2 >> 3 & 4));
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      if ((uVar3 - 1 != uVar4) && (pCut->pLeaves[uVar4 + 1] <= (int)uVar2)) {
        __assert_fail("pCut->pLeaves[i] < pCut->pLeaves[i+1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x1cd,"void Lpk_NodeCutSignature(Lpk_Cut_t *)");
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void Lpk_NodeCutSignature( Lpk_Cut_t * pCut )
{
    unsigned i;
    pCut->uSign[0] = pCut->uSign[1] = 0;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pCut->uSign[(pCut->pLeaves[i] & 32) > 0] |= (1 << (pCut->pLeaves[i] & 31));
        if ( i != pCut->nLeaves - 1 )
            assert( pCut->pLeaves[i] < pCut->pLeaves[i+1] );
    }
}